

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void Luv24toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  double v;
  double u;
  double local_40;
  double local_38;
  
  if (0 < n) {
    puVar4 = (uint *)sp->tbuf;
    lVar3 = n + 1;
    do {
      uVar1 = *puVar4;
      *(ushort *)op = ((ushort)(uVar1 >> 0xc) & 0xffd) + 0x3402;
      iVar2 = uv_decode(&local_38,&local_40,uVar1 & 0x3fff);
      if (iVar2 < 0) {
        local_38 = 0.210526316;
        local_40 = 0.473684211;
      }
      *(short *)((long)op + 2) = (short)(int)(local_38 * 32768.0);
      *(short *)((long)op + 4) = (short)(int)(local_40 * 32768.0);
      puVar4 = puVar4 + 1;
      lVar3 = lVar3 + -1;
      op = (uint8_t *)((long)op + 6);
    } while (1 < lVar3);
  }
  return;
}

Assistant:

static void Luv24toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)((*luv >> 12 & 0xffd) + 13314);
        if (uv_decode(&u, &v, *luv & 0x3fff) < 0)
        {
            u = U_NEU;
            v = V_NEU;
        }
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}